

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-utf8.h
# Opt level: O0

int fy_utf8_count(void *ptr,size_t len)

{
  int iVar1;
  int local_30;
  int count;
  int w;
  uint8_t *e;
  uint8_t *s;
  size_t len_local;
  void *ptr_local;
  
  local_30 = 0;
  for (e = (uint8_t *)ptr;
      ((e < (uint8_t *)((long)ptr + len) && (iVar1 = fy_utf8_width_by_first_octet(*e), iVar1 != 0))
      && (e + iVar1 <= (uint8_t *)((long)ptr + len))); e = e + iVar1) {
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

static inline int fy_utf8_count(const void *ptr, size_t len) {
    const uint8_t *s = ptr, *e = ptr + len;
    int w, count;

    count = 0;
    while (s < e) {
        w = fy_utf8_width_by_first_octet(*s);

        /* malformed? */
        if (!w || s + w > e)
            break;
        s += w;

        count++;
    }

    return count;
}